

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool ts_parser__better_version_exists
                (TSParser *self,StackVersion version,_Bool is_in_error,uint cost)

{
  StackVersion SVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  ErrorComparison EVar6;
  undefined8 uVar7;
  undefined7 in_register_00000011;
  StackVersion version_00;
  undefined8 in_R8;
  bool bVar8;
  ErrorStatus EVar9;
  Length LVar10;
  Length LVar11;
  ErrorStatus a;
  ErrorStatus b;
  uint local_38;
  
  if (((self->finished_tree).ptr != (SubtreeHeapData *)0x0) &&
     (uVar3 = ts_subtree_error_cost(self->finished_tree),
     uVar3 <= (uint)CONCAT71(in_register_00000011,is_in_error))) {
    return true;
  }
  LVar10 = ts_stack_position(self->stack,version);
  uVar4 = ts_stack_node_count_since_error(self->stack,version);
  uVar5 = ts_stack_dynamic_precedence(self->stack,version);
  a.node_count = 0;
  a.cost = uVar5;
  SVar1 = (self->stack->heads).size;
  version_00 = 0;
  do {
    bVar8 = SVar1 != version_00;
    if (!bVar8) {
      return bVar8;
    }
    if ((version != version_00) && (_Var2 = ts_stack_is_active(self->stack,version_00), _Var2)) {
      LVar11 = ts_stack_position(self->stack,version_00);
      local_38 = LVar10.bytes;
      if (local_38 <= LVar11.bytes) {
        EVar9 = ts_parser__version_status(self,version_00);
        uVar7 = EVar9._0_8_;
        a.dynamic_precedence = (int)uVar7;
        a.is_in_error = (_Bool)(char)((ulong)uVar7 >> 0x20);
        a._13_3_ = (int3)((ulong)uVar7 >> 0x28);
        b.dynamic_precedence = (int)in_R8;
        b.is_in_error = (_Bool)(char)((ulong)in_R8 >> 0x20);
        b._13_3_ = (int3)((ulong)in_R8 >> 0x28);
        b.cost = (int)EVar9._8_8_;
        b.node_count = (int)((ulong)EVar9._8_8_ >> 0x20);
        EVar6 = ts_parser__compare_versions
                          ((TSParser *)
                           ((ulong)uVar4 << 0x20 |
                           CONCAT71(in_register_00000011,is_in_error) & 0xffffffff),a,b);
        if (EVar6 == ErrorComparisonPreferRight) {
          _Var2 = ts_stack_can_merge(self->stack,version_00,version);
          if (_Var2) {
            return bVar8;
          }
        }
        else if (EVar6 == ErrorComparisonTakeRight) {
          return bVar8;
        }
      }
    }
    version_00 = version_00 + 1;
  } while( true );
}

Assistant:

static bool ts_parser__better_version_exists(TSParser *self, StackVersion version,
                                             bool is_in_error, unsigned cost) {
  if (self->finished_tree.ptr && ts_subtree_error_cost(self->finished_tree) <= cost) {
    return true;
  }

  Length position = ts_stack_position(self->stack, version);
  ErrorStatus status = {
    .cost = cost,
    .is_in_error = is_in_error,
    .dynamic_precedence = ts_stack_dynamic_precedence(self->stack, version),
    .node_count = ts_stack_node_count_since_error(self->stack, version),
  };

  for (StackVersion i = 0, n = ts_stack_version_count(self->stack); i < n; i++) {
    if (i == version ||
        !ts_stack_is_active(self->stack, i) ||
        ts_stack_position(self->stack, i).bytes < position.bytes) continue;
    ErrorStatus status_i = ts_parser__version_status(self, i);
    switch (ts_parser__compare_versions(self, status, status_i)) {
      case ErrorComparisonTakeRight:
        return true;
      case ErrorComparisonPreferRight:
        if (ts_stack_can_merge(self->stack, i, version)) return true;
      default:
        break;
    }
  }

  return false;
}